

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy_io.c
# Opt level: O0

CONCRETE_IO_HANDLE http_proxy_io_create(void *io_create_parameters)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IO_INTERFACE_DESCRIPTION *io_interface_description;
  XIO_HANDLE pXVar3;
  LOGGER_LOG l_9;
  SOCKETIO_CONFIG socket_io_config;
  LOGGER_LOG l_8;
  IO_INTERFACE_DESCRIPTION *underlying_io_interface;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  HTTP_PROXY_IO_CONFIG *http_proxy_io_config;
  LOGGER_LOG l;
  HTTP_PROXY_IO_INSTANCE *result;
  void *io_create_parameters_local;
  
  if (io_create_parameters == (void *)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                ,"http_proxy_io_create",0x3b,1,"NULL io_create_parameters.");
    }
  }
  else if ((*io_create_parameters == 0) || (*(long *)((long)io_create_parameters + 0x10) == 0)) {
    l = (LOGGER_LOG)0x0;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                ,"http_proxy_io_create",0x47,1,"Bad arguments: hostname = %p, proxy_hostname = %p",
                *io_create_parameters,*(undefined8 *)((long)io_create_parameters + 0x10));
    }
  }
  else if (((*(long *)((long)io_create_parameters + 0x20) == 0) &&
           (*(long *)((long)io_create_parameters + 0x28) != 0)) ||
          ((*(long *)((long)io_create_parameters + 0x20) != 0 &&
           (*(long *)((long)io_create_parameters + 0x28) == 0)))) {
    l = (LOGGER_LOG)0x0;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                ,"http_proxy_io_create",0x4f,1,"Bad arguments: username = %p, password = %p",
                *(undefined8 *)((long)io_create_parameters + 0x20),
                *(undefined8 *)((long)io_create_parameters + 0x28));
    }
  }
  else {
    l = (LOGGER_LOG)calloc(1,0x90);
    if (l == (LOGGER_LOG)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                  ,"http_proxy_io_create",0x58,1,"Failed allocating HTTP proxy IO instance.");
      }
    }
    else {
      iVar1 = mallocAndStrcpy_s((char **)(l + 0x48),*io_create_parameters);
      if (iVar1 == 0) {
        iVar1 = mallocAndStrcpy_s((char **)(l + 0x58),*(char **)((long)io_create_parameters + 0x10))
        ;
        if (iVar1 == 0) {
          *(undefined8 *)(l + 0x68) = 0;
          *(undefined8 *)(l + 0x70) = 0;
          if ((*(long *)((long)io_create_parameters + 0x20) == 0) ||
             (iVar1 = mallocAndStrcpy_s((char **)(l + 0x68),
                                        *(char **)((long)io_create_parameters + 0x20)), iVar1 == 0))
          {
            if ((*(long *)((long)io_create_parameters + 0x28) == 0) ||
               (iVar1 = mallocAndStrcpy_s((char **)(l + 0x70),
                                          *(char **)((long)io_create_parameters + 0x28)), iVar1 == 0
               )) {
              io_interface_description = socketio_get_interface_description();
              if (io_interface_description == (IO_INTERFACE_DESCRIPTION *)0x0) {
                socket_io_config.accepted_socket = xlogging_get_log_function();
                if ((LOGGER_LOG)socket_io_config.accepted_socket != (LOGGER_LOG)0x0) {
                  (*(code *)socket_io_config.accepted_socket)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                             ,"http_proxy_io_create",0x99,1,
                             "Unable to get the socket IO interface description.");
                }
                free(*(void **)(l + 0x70));
                free(*(void **)(l + 0x68));
                free(*(void **)(l + 0x58));
                free(*(void **)(l + 0x48));
                free(l);
                l = (LOGGER_LOG)0x0;
              }
              else {
                l_9 = *(LOGGER_LOG *)((long)io_create_parameters + 0x10);
                socket_io_config.hostname._0_4_ = *(undefined4 *)((long)io_create_parameters + 0x18)
                ;
                socket_io_config.port = 0;
                socket_io_config._12_4_ = 0;
                pXVar3 = xio_create(io_interface_description,&l_9);
                *(XIO_HANDLE *)(l + 0x78) = pXVar3;
                if (*(long *)(l + 0x78) == 0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                              ,"http_proxy_io_create",0xb0,1,"Unable to create the underlying IO.");
                  }
                  free(*(void **)(l + 0x70));
                  free(*(void **)(l + 0x68));
                  free(*(void **)(l + 0x58));
                  free(*(void **)(l + 0x48));
                  free(l);
                  l = (LOGGER_LOG)0x0;
                }
                else {
                  *(undefined4 *)(l + 0x50) = *(undefined4 *)((long)io_create_parameters + 8);
                  *(undefined4 *)(l + 0x60) = *(undefined4 *)((long)io_create_parameters + 0x18);
                  *(undefined8 *)(l + 0x80) = 0;
                  *(undefined8 *)(l + 0x88) = 0;
                  *(undefined4 *)l = 0;
                }
              }
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                          ,"http_proxy_io_create",0x8a,1,"Failed to copy the passowrd.");
              }
              free(*(void **)(l + 0x68));
              free(*(void **)(l + 0x58));
              free(*(void **)(l + 0x48));
              free(l);
              l = (LOGGER_LOG)0x0;
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                        ,"http_proxy_io_create",0x7c,1,"Failed to copy the username.");
            }
            free(*(void **)(l + 0x58));
            free(*(void **)(l + 0x48));
            free(l);
            l = (LOGGER_LOG)0x0;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                      ,"http_proxy_io_create",0x6c,1,"Failed to copy the proxy_hostname.");
          }
          free(*(void **)(l + 0x48));
          free(l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                    ,"http_proxy_io_create",0x61,1,"Failed to copy the hostname.");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return l;
}

Assistant:

static CONCRETE_IO_HANDLE http_proxy_io_create(void* io_create_parameters)
{
    HTTP_PROXY_IO_INSTANCE* result;

    if (io_create_parameters == NULL)
    {
        /* Codes_SRS_HTTP_PROXY_IO_01_002: [ If io_create_parameters is NULL, http_proxy_io_create shall fail and return NULL. ]*/
        result = NULL;
        LogError("NULL io_create_parameters.");
    }
    else
    {
        /* Codes_SRS_HTTP_PROXY_IO_01_003: [ io_create_parameters shall be used as an HTTP_PROXY_IO_CONFIG*. ]*/
        HTTP_PROXY_IO_CONFIG* http_proxy_io_config = (HTTP_PROXY_IO_CONFIG*)io_create_parameters;
        if ((http_proxy_io_config->hostname == NULL) ||
            (http_proxy_io_config->proxy_hostname == NULL))
        {
            /* Codes_SRS_HTTP_PROXY_IO_01_004: [ If the hostname or proxy_hostname member is NULL, then http_proxy_io_create shall fail and return NULL. ]*/
            result = NULL;
            LogError("Bad arguments: hostname = %p, proxy_hostname = %p",
                http_proxy_io_config->hostname, http_proxy_io_config->proxy_hostname);
        }
        /* Codes_SRS_HTTP_PROXY_IO_01_095: [ If one of the fields username and password is non-NULL, then the other has to be also non-NULL, otherwise http_proxy_io_create shall fail and return NULL. ]*/
        else if (((http_proxy_io_config->username == NULL) && (http_proxy_io_config->password != NULL)) ||
            ((http_proxy_io_config->username != NULL) && (http_proxy_io_config->password == NULL)))
        {
            result = NULL;
            LogError("Bad arguments: username = %p, password = %p",
                http_proxy_io_config->username, http_proxy_io_config->password);
        }
        else
        {
            /* Codes_SRS_HTTP_PROXY_IO_01_001: [ http_proxy_io_create shall create a new instance of the HTTP proxy IO. ]*/
            result = (HTTP_PROXY_IO_INSTANCE*)calloc(1, sizeof(HTTP_PROXY_IO_INSTANCE));
            if (result == NULL)
            {
                /* Codes_SRS_HTTP_PROXY_IO_01_051: [ If allocating memory for the new instance fails, http_proxy_io_create shall fail and return NULL. ]*/
                LogError("Failed allocating HTTP proxy IO instance.");
            }
            else
            {
                /* Codes_SRS_HTTP_PROXY_IO_01_005: [ http_proxy_io_create shall copy the hostname, port, username and password values for later use when the actual CONNECT is performed. ]*/
                /* Codes_SRS_HTTP_PROXY_IO_01_006: [ hostname and proxy_hostname, username and password shall be copied by calling mallocAndStrcpy_s. ]*/
                if (mallocAndStrcpy_s(&result->hostname, http_proxy_io_config->hostname) != 0)
                {
                    /* Codes_SRS_HTTP_PROXY_IO_01_007: [ If mallocAndStrcpy_s fails then http_proxy_io_create shall fail and return NULL. ]*/
                    LogError("Failed to copy the hostname.");
                    /* Codes_SRS_HTTP_PROXY_IO_01_008: [ When http_proxy_io_create fails, all allocated resources up to that point shall be freed. ]*/
                    free(result);
                    result = NULL;
                }
                else
                {
                    /* Codes_SRS_HTTP_PROXY_IO_01_006: [ hostname and proxy_hostname, username and password shall be copied by calling mallocAndStrcpy_s. ]*/
                    if (mallocAndStrcpy_s(&result->proxy_hostname, http_proxy_io_config->proxy_hostname) != 0)
                    {
                        /* Codes_SRS_HTTP_PROXY_IO_01_007: [ If mallocAndStrcpy_s fails then http_proxy_io_create shall fail and return NULL. ]*/
                        LogError("Failed to copy the proxy_hostname.");
                        /* Codes_SRS_HTTP_PROXY_IO_01_008: [ When http_proxy_io_create fails, all allocated resources up to that point shall be freed. ]*/
                        free(result->hostname);
                        free(result);
                        result = NULL;
                    }
                    else
                    {
                        result->username = NULL;
                        result->password = NULL;

                        /* Codes_SRS_HTTP_PROXY_IO_01_006: [ hostname and proxy_hostname, username and password shall be copied by calling mallocAndStrcpy_s. ]*/
                        /* Codes_SRS_HTTP_PROXY_IO_01_094: [ username and password shall be optional. ]*/
                        if ((http_proxy_io_config->username != NULL) && (mallocAndStrcpy_s(&result->username, http_proxy_io_config->username) != 0))
                        {
                            /* Codes_SRS_HTTP_PROXY_IO_01_007: [ If mallocAndStrcpy_s fails then http_proxy_io_create shall fail and return NULL. ]*/
                            LogError("Failed to copy the username.");
                            /* Codes_SRS_HTTP_PROXY_IO_01_008: [ When http_proxy_io_create fails, all allocated resources up to that point shall be freed. ]*/
                            free(result->proxy_hostname);
                            free(result->hostname);
                            free(result);
                            result = NULL;
                        }
                        else
                        {
                            /* Codes_SRS_HTTP_PROXY_IO_01_006: [ hostname and proxy_hostname, username and password shall be copied by calling mallocAndStrcpy_s. ]*/
                            /* Codes_SRS_HTTP_PROXY_IO_01_094: [ username and password shall be optional. ]*/
                            if ((http_proxy_io_config->password != NULL) && (mallocAndStrcpy_s(&result->password, http_proxy_io_config->password) != 0))
                            {
                                /* Codes_SRS_HTTP_PROXY_IO_01_007: [ If mallocAndStrcpy_s fails then http_proxy_io_create shall fail and return NULL. ]*/
                                LogError("Failed to copy the passowrd.");
                                /* Codes_SRS_HTTP_PROXY_IO_01_008: [ When http_proxy_io_create fails, all allocated resources up to that point shall be freed. ]*/
                                free(result->username);
                                free(result->proxy_hostname);
                                free(result->hostname);
                                free(result);
                                result = NULL;
                            }
                            else
                            {
                                /* Codes_SRS_HTTP_PROXY_IO_01_010: [ - io_interface_description shall be set to the result of socketio_get_interface_description. ]*/
                                const IO_INTERFACE_DESCRIPTION* underlying_io_interface = socketio_get_interface_description();
                                if (underlying_io_interface == NULL)
                                {
                                    /* Codes_SRS_HTTP_PROXY_IO_01_050: [ If socketio_get_interface_description fails, http_proxy_io_create shall fail and return NULL. ]*/
                                    LogError("Unable to get the socket IO interface description.");
                                    /* Codes_SRS_HTTP_PROXY_IO_01_008: [ When http_proxy_io_create fails, all allocated resources up to that point shall be freed. ]*/
                                    free(result->password);
                                    free(result->username);
                                    free(result->proxy_hostname);
                                    free(result->hostname);
                                    free(result);
                                    result = NULL;
                                }
                                else
                                {
                                    SOCKETIO_CONFIG socket_io_config;

                                    /* Codes_SRS_HTTP_PROXY_IO_01_011: [ - xio_create_parameters shall be set to a SOCKETIO_CONFIG* where hostname is set to the proxy_hostname member of io_create_parameters and port is set to the proxy_port member of io_create_parameters. ]*/
                                    socket_io_config.hostname = http_proxy_io_config->proxy_hostname;
                                    socket_io_config.port = http_proxy_io_config->proxy_port;
                                    socket_io_config.accepted_socket = NULL;

                                    /* Codes_SRS_HTTP_PROXY_IO_01_009: [ http_proxy_io_create shall create a new socket IO by calling xio_create with the arguments: ]*/
                                    result->underlying_io = xio_create(underlying_io_interface, &socket_io_config);
                                    if (result->underlying_io == NULL)
                                    {
                                        /* Codes_SRS_HTTP_PROXY_IO_01_012: [ If xio_create fails, http_proxy_io_create shall fail and return NULL. ]*/
                                        LogError("Unable to create the underlying IO.");
                                        /* Codes_SRS_HTTP_PROXY_IO_01_008: [ When http_proxy_io_create fails, all allocated resources up to that point shall be freed. ]*/
                                        free(result->password);
                                        free(result->username);
                                        free(result->proxy_hostname);
                                        free(result->hostname);
                                        free(result);
                                        result = NULL;
                                    }
                                    else
                                    {
                                        result->port = http_proxy_io_config->port;
                                        result->proxy_port = http_proxy_io_config->proxy_port;
                                        result->receive_buffer = NULL;
                                        result->receive_buffer_size = 0;
                                        result->http_proxy_io_state = HTTP_PROXY_IO_STATE_CLOSED;
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    return result;
}